

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstats.cpp
# Opt level: O0

void kernel::ApplyStats(CCoinsStats *stats,uint256 *hash,
                       map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                       *outputs)

{
  long lVar1;
  bool bVar2;
  long *plVar3;
  uint64_t uVar4;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *in_RDX;
  _Self *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  optional<long> oVar5;
  const_iterator it;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *in_stack_ffffffffffffffb8;
  undefined7 uStack_f;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::
          map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
          ::empty(in_stack_ffffffffffffffb8);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!outputs.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/coinstats.cpp"
                  ,0x67,
                  "void kernel::ApplyStats(CCoinsStats &, const uint256 &, const std::map<uint32_t, Coin> &)"
                 );
  }
  *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + 1;
  std::
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  ::begin(in_RDX);
  while( true ) {
    std::
    map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
    ::end(in_RDX);
    bVar2 = std::operator==(in_RSI,(_Self *)in_RDX);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
    bVar2 = std::optional<long>::has_value((optional<long> *)in_stack_ffffffffffffffb8);
    if (bVar2) {
      plVar3 = std::optional<long>::operator*((optional<long> *)in_stack_ffffffffffffffb8);
      in_stack_ffffffffffffffb8 =
           (map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
            *)*plVar3;
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_Coin>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_Coin>_> *)
                 in_stack_ffffffffffffffb8);
      oVar5 = CheckedAdd<long>(in_RDI,(long)in_RSI);
      ((_Storage<long,_true> *)(in_RDI + 0x68))->_M_value =
           oVar5.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
      *(ulong *)(in_RDI + 0x70) =
           CONCAT71(uStack_f,oVar5.super__Optional_base<long,_true,_true>._M_payload.
                             super__Optional_payload_base<long>._M_engaged);
    }
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_Coin>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_Coin>_> *)
               in_stack_ffffffffffffffb8);
    uVar4 = GetBogoSize((CScript *)in_stack_ffffffffffffffb8);
    *(uint64_t *)(in_RDI + 0x38) = uVar4 + *(long *)(in_RDI + 0x38);
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_Coin>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_Coin>_> *)
               in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void ApplyStats(CCoinsStats& stats, const uint256& hash, const std::map<uint32_t, Coin>& outputs)
{
    assert(!outputs.empty());
    stats.nTransactions++;
    for (auto it = outputs.begin(); it != outputs.end(); ++it) {
        stats.nTransactionOutputs++;
        if (stats.total_amount.has_value()) {
            stats.total_amount = CheckedAdd(*stats.total_amount, it->second.out.nValue);
        }
        stats.nBogoSize += GetBogoSize(it->second.out.scriptPubKey);
    }
}